

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O2

string * __thiscall
soul::CompileMessage::getFullDescriptionWithoutFilename_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  string filename;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if ((this->location).location.data != (char *)0x0) {
    getPositionString_abi_cxx11_(&sStack_98,this);
    std::operator+(&local_78,&sStack_98,": ");
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&sStack_98);
  }
  getSeverity_abi_cxx11_(&local_38,this);
  std::operator+(&sStack_98,&local_58,&local_38);
  std::operator+(&local_78,&sStack_98,": ");
  std::operator+(__return_storage_ptr__,&local_78,&this->description);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getFullDescriptionWithoutFilename() const
{
    std::string filename;

    if (hasPosition())
        filename = getPositionString() + ": ";

    return filename + getSeverity() + ": " + description;
}